

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::clear
          (InnerMap *this)

{
  void **ppvVar1;
  Node *pNVar2;
  _Base_ptr p_Var3;
  Tree *tree;
  Node *node;
  const_iterator __position;
  ulong uVar4;
  
  for (uVar4 = 0; uVar4 < this->num_buckets_; uVar4 = uVar4 + 1) {
    ppvVar1 = this->table_;
    node = (Node *)ppvVar1[uVar4];
    if (node != (Node *)0x0) {
      if (node == (Node *)ppvVar1[uVar4 ^ 1]) {
        ppvVar1[uVar4 + 1] = (void *)0x0;
        this->table_[uVar4] = (void *)0x0;
        uVar4 = uVar4 + 1;
        __position._M_node = (_Base_ptr)node[1].kv.k_.val_.string_value_;
        do {
          pNVar2 = *(Node **)(__position._M_node + 1);
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
          ::erase_abi_cxx11_((_Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
                              *)node,__position);
          DestroyNode(this,pNVar2);
          __position._M_node = p_Var3;
        } while (p_Var3 != (_Base_ptr)&(node->kv).v_);
        DestroyTree(this,(Tree *)node);
      }
      else {
        ppvVar1[uVar4] = (void *)0x0;
        do {
          pNVar2 = node->next;
          DestroyNode(this,node);
          node = pNVar2;
        } while (pNVar2 != (Node *)0x0);
      }
    }
  }
  this->num_elements_ = 0;
  this->index_of_first_non_null_ = this->num_buckets_;
  return;
}

Assistant:

void clear() {
      for (size_type b = 0; b < num_buckets_; b++) {
        if (TableEntryIsNonEmptyList(b)) {
          Node* node = static_cast<Node*>(table_[b]);
          table_[b] = NULL;
          do {
            Node* next = node->next;
            DestroyNode(node);
            node = next;
          } while (node != NULL);
        } else if (TableEntryIsTree(b)) {
          Tree* tree = static_cast<Tree*>(table_[b]);
          GOOGLE_DCHECK(table_[b] == table_[b + 1] && (b & 1) == 0);
          table_[b] = table_[b + 1] = NULL;
          typename Tree::iterator tree_it = tree->begin();
          do {
            Node* node = NodePtrFromKeyPtr(*tree_it);
            typename Tree::iterator next = tree_it;
            ++next;
            tree->erase(tree_it);
            DestroyNode(node);
            tree_it = next;
          } while (tree_it != tree->end());
          DestroyTree(tree);
          b++;
        }
      }
      num_elements_ = 0;
      index_of_first_non_null_ = num_buckets_;
    }